

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

void bsFinishWrite(EState *s)

{
  EState *s_local;
  
  while (0 < s->bsLive) {
    s->zbits[s->numZ] = (UChar)(s->bsBuff >> 0x18);
    s->numZ = s->numZ + 1;
    s->bsBuff = s->bsBuff << 8;
    s->bsLive = s->bsLive + -8;
  }
  return;
}

Assistant:

static
void bsFinishWrite ( EState* s )
{
   while (s->bsLive > 0) {
      s->zbits[s->numZ] = (UChar)(s->bsBuff >> 24);
      s->numZ++;
      s->bsBuff <<= 8;
      s->bsLive -= 8;
   }
}